

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcLits.c
# Opt level: O2

int Mvc_CoverIsOneLiteral(Mvc_Cover_t *pCover)

{
  int iVar1;
  Mvc_Cube_t *pMVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  
  iVar1 = Mvc_CoverReadCubeNum(pCover);
  if (iVar1 == 1) {
    pMVar2 = Mvc_CoverReadCubeHead(pCover);
    uVar5 = 0;
    uVar3 = pCover->nBits;
    if (pCover->nBits < 1) {
      uVar3 = 0;
    }
    iVar1 = 1;
    iVar6 = 0;
    while (uVar4 = (uint)uVar5, uVar3 != uVar4) {
      if (((pMVar2->pData[uVar5 >> 5] >> (uVar4 & 0x1f) & 1) != 0) &&
         (bVar7 = iVar6 != 0, iVar6 = iVar1, bVar7)) goto LAB_006f9c6d;
      uVar5 = (ulong)(uVar4 + 1);
    }
  }
  else {
LAB_006f9c6d:
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int Mvc_CoverIsOneLiteral( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;
    int iBit, Counter, Value;
    if ( Mvc_CoverReadCubeNum(pCover) != 1 )
        return 0;
    pCube = Mvc_CoverReadCubeHead(pCover);
    // count literals
    Counter = 0;
    Mvc_CubeForEachBit( pCover, pCube, iBit, Value )
    {
        if ( Value )
        {
            if ( Counter++ )
                return 0;
        }
    }
    return 1;
}